

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node_struct *
pugi::impl::anon_unknown_0::append_new_node
          (xml_node_struct *node,xml_allocator *alloc,xml_node_type type)

{
  bool bVar1;
  xml_node_struct *child;
  xml_node_type type_local;
  xml_allocator *alloc_local;
  xml_node_struct *node_local;
  
  bVar1 = xml_allocator::reserve(alloc);
  if (bVar1) {
    node_local = allocate_node(alloc,type);
    if (node_local == (xml_node_struct *)0x0) {
      node_local = (xml_node_struct *)0x0;
    }
    else {
      append_node(node_local,node);
    }
  }
  else {
    node_local = (xml_node_struct *)0x0;
  }
  return node_local;
}

Assistant:

PUGI_IMPL_FN_NO_INLINE xml_node_struct* append_new_node(xml_node_struct* node, xml_allocator& alloc, xml_node_type type = node_element)
	{
		if (!alloc.reserve()) return 0;

		xml_node_struct* child = allocate_node(alloc, type);
		if (!child) return 0;

		append_node(child, node);

		return child;
	}